

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

vector<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>_>_>,_poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>_>_>,_std::integral_constant<bool,_true>_>_>
* __thiscall
poly::
vector<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>_>_>,_poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>_>_>,_std::integral_constant<bool,_true>_>_>
::copy_assign_impl(vector<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>_>_>,_poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>_>_>,_std::integral_constant<bool,_true>_>_>
                   *this,vector<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>_>_>,_poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>_>_>,_std::integral_constant<bool,_true>_>_>
                         *rhs)

{
  my_base *pmVar1;
  my_base *this_00;
  size_type sVar2;
  elem_ptr_pointer dst_ptr;
  elem_ptr_const_pointer begin;
  elem_ptr_const_pointer _free;
  elem_ptr_const_pointer end;
  poly_copy_descr local_30;
  vector<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>_>_>,_poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>_>_>,_std::integral_constant<bool,_true>_>_>
  *local_18;
  vector<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>_>_>,_poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>_>_>,_std::integral_constant<bool,_true>_>_>
  *rhs_local;
  vector<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>_>_>,_poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>_>_>,_std::integral_constant<bool,_true>_>_>
  *this_local;
  
  local_18 = rhs;
  rhs_local = this;
  tidy(this);
  pmVar1 = base(local_18);
  this_00 = base(this);
  vector_impl::
  allocator_base<custom::Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>_>_>_>
  ::operator=(this_00,pmVar1);
  sVar2 = capacity(local_18);
  init_ptrs(this,sVar2);
  this->_align_max = local_18->_align_max;
  pmVar1 = base(this);
  dst_ptr = begin_elem(this);
  begin = begin_elem(local_18);
  _free = end_elem(local_18);
  end = last_elem(local_18);
  sVar2 = max_align(local_18);
  poly_uninitialized_copy(&local_30,pmVar1,dst_ptr,begin,_free,end,sVar2);
  set_ptrs(this,&local_30);
  return this;
}

Assistant:

inline auto vector<I, A, C>::copy_assign_impl(const vector& rhs) -> vector&
{
    tidy();
    base() = rhs.base();
    init_ptrs(rhs.capacity());
    _align_max = rhs._align_max;
    set_ptrs(poly_uninitialized_copy(
        base(), begin_elem(), rhs.begin_elem(), rhs.end_elem(), rhs.last_elem(), rhs.max_align()));
    return *this;
}